

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_address.cpp
# Opt level: O0

void __thiscall
cfdcapi_address_CfdCreateAddressTest_Test::TestBody(cfdcapi_address_CfdCreateAddressTest_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  char *message;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *address;
  char *locking_script;
  size_t idx;
  size_t list_size;
  CfdCreateAddressExpectData exp_datas [2];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  char **in_stack_000005e0;
  int in_stack_000005ec;
  char *in_stack_000005f0;
  char *in_stack_000005f8;
  int in_stack_00000604;
  void *in_stack_00000608;
  char **in_stack_00000620;
  char **in_stack_00000628;
  bool *in_stack_fffffffffffffd88;
  AssertionResult *in_stack_fffffffffffffd90;
  CfdErrorCode *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  void **in_stack_fffffffffffffda8;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined4 local_1ac;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  AssertionResult local_188;
  char *local_178;
  AssertHelper local_170;
  Message local_168;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  AssertionResult local_140;
  AssertHelper local_130;
  Message local_128;
  undefined4 local_11c;
  AssertionResult local_118;
  char *local_108;
  char *local_100;
  ulong local_f8;
  ulong local_f0;
  undefined1 local_e8 [24];
  undefined8 auStack_d0 [7];
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffda8);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (int *)in_stack_fffffffffffffd90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    in_stack_fffffffffffffe28 =
         testing::AssertionResult::failure_message((AssertionResult *)0x30161a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x2a9,in_stack_fffffffffffffe28);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x30167d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3016d2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,(type *)0x301706);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x2aa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x301802);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30187d);
  memcpy(local_e8,&DAT_009f1000,0x50);
  local_f0 = 2;
  for (local_f8 = 0; local_f8 < local_f0; local_f8 = local_f8 + 1) {
    local_100 = (char *)0x0;
    local_108 = (char *)0x0;
    in_stack_fffffffffffffd90 = (AssertionResult *)0x0;
    local_14 = CfdCreateAddress(in_stack_00000608,in_stack_00000604,in_stack_000005f8,
                                in_stack_000005f0,in_stack_000005ec,in_stack_000005e0,
                                in_stack_00000620,in_stack_00000628);
    local_11c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98
               ,(int *)in_stack_fffffffffffffd90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3019e6);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
                 ,0x2d0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      testing::Message::~Message((Message *)0x301a43);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x301a98);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_140,"exp_datas[idx].address","address",
                 (char *)auStack_d0[local_f8 * 5],local_108);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
      if (!bVar1) {
        testing::Message::Message(&local_148);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x301b48);
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2d2,pcVar3);
        testing::internal::AssertHelper::operator=(&local_150,&local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        testing::Message::~Message((Message *)0x301ba5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x301bfa);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_160,"exp_datas[idx].locking_script","locking_script",
                 (char *)auStack_d0[local_f8 * 5 + 1],local_100);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
      if (!bVar1) {
        testing::Message::Message(&local_168);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x301c9c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2d3,pcVar3);
        testing::internal::AssertHelper::operator=(&local_170,&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        testing::Message::~Message((Message *)0x301cf9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x301d4e);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffd98);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffd98);
    }
    else {
      local_178 = (char *)0x0;
      local_14 = CfdGetLastErrorMessage
                           (in_stack_fffffffffffffe28,
                            (char **)CONCAT17(uVar2,in_stack_fffffffffffffe20));
      if (local_14 == 0) {
        testing::internal::CmpHelperSTREQ((internal *)&local_188,"\"\"","message","",local_178);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
        if (!bVar1) {
          testing::Message::Message(&local_190);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x301e38);
          testing::internal::AssertHelper::AssertHelper
                    (&local_198,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
                     ,0x2da,pcVar3);
          testing::internal::AssertHelper::operator=(&local_198,&local_190);
          testing::internal::AssertHelper::~AssertHelper(&local_198);
          testing::Message::~Message((Message *)0x301e95);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x301eea);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffffd98);
      }
    }
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffd98);
  local_1ac = 0;
  this_00 = &local_1a8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&this_00->success_,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (int *)in_stack_fffffffffffffd90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x301fcb);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x2e1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::Message::~Message((Message *)0x302028);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30207d);
  return;
}

Assistant:

TEST(cfdcapi_address, CfdCreateAddressTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  struct CfdCreateAddressExpectData {
    const char* pubkey;
    const char* script;
    int hash_type;
    int network;
    const char* address;
    const char* locking_script;
  };

  const struct CfdCreateAddressExpectData exp_datas[] = {
    {  // taproot testnet
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "",
      kCfdTaproot,
      kCfdNetworkTestnet,
      "tb1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naskf8ee6",
      "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb"
    },
    {  // taproot regtest
      "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799",
      "",
      kCfdTaproot,
      kCfdNetworkRegtest,
      "bcrt1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsn6c9jz",
      "512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799"
    },
  };
  size_t list_size = sizeof(exp_datas) / sizeof(struct CfdCreateAddressExpectData);

  for (size_t idx = 0; idx < list_size; ++idx) {
    char* locking_script = nullptr;
    char* address = nullptr;
    ret = CfdCreateAddress(
        handle, exp_datas[idx].hash_type, exp_datas[idx].pubkey,
        exp_datas[idx].script, exp_datas[idx].network,
        &address, &locking_script, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_datas[idx].address, address);
      EXPECT_STREQ(exp_datas[idx].locking_script, locking_script);
      CfdFreeStringBuffer(locking_script);
      CfdFreeStringBuffer(address);
    } else {
      char* message = nullptr;
      ret = CfdGetLastErrorMessage(handle, &message);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("", message);
        CfdFreeStringBuffer(message);
      }
    }
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}